

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_misc.c
# Opt level: O1

int lj_cf_misc_sysprof_start(lua_State *L)

{
  char cVar1;
  int iVar2;
  int iVar3;
  GCtab *t;
  GCstr *pGVar4;
  cTValue *pcVar5;
  ulong uVar6;
  char *pcVar7;
  int *piVar8;
  char *pcVar9;
  long lVar10;
  luam_Sysprof_Options opt;
  luam_Sysprof_Options local_58;
  
  local_58.buf = (uint8_t *)0x0;
  local_58.len = 0;
  local_58._0_8_ = 0;
  local_58.interval = 0;
  local_58.ctx = (int *)0x0;
  if ((int)((ulong)((long)L->top - (long)L->base) >> 3) == 0) {
    local_58._0_8_ = 0;
    local_58.interval = 10;
    pcVar7 = (char *)0x0;
    iVar2 = 0;
    goto LAB_001222b3;
  }
  t = lj_lib_checktab(L,1);
  pGVar4 = lj_str_new(L,"mode",4);
  pcVar5 = lj_tab_getstr(t,pGVar4);
  if (pcVar5 == (cTValue *)0x0) {
    pcVar7 = (char *)0x0;
LAB_0012227a:
    pcVar9 = "D";
    if (pcVar7 != (char *)0x0) {
      pcVar9 = pcVar7;
    }
    cVar1 = *pcVar9;
    if (cVar1 == 'C') {
      local_58.mode = 2;
    }
    else if (cVar1 == 'L') {
      local_58.mode = 1;
    }
    else {
      if (cVar1 != 'D') goto LAB_001222a0;
      local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
    }
    pGVar4 = lj_str_new(L,"interval",8);
    pcVar5 = lj_tab_getstr(t,pGVar4);
    local_58.interval = 10;
    iVar2 = 0;
    if ((pcVar5 == (cTValue *)0x0) || (0xfffeffff < (pcVar5->field_2).it)) {
LAB_00122363:
      pcVar7 = (char *)0x0;
      if (local_58.mode == '\0') goto LAB_001222b3;
      pGVar4 = lj_str_new(L,"path",4);
      pcVar5 = lj_tab_getstr(t,pGVar4);
      if (pcVar5 == (cTValue *)0x0) {
        pcVar7 = "sysprof.bin";
      }
      else {
        if ((pcVar5->field_2).it != 0xfffffffb) {
          lVar10 = 0xf8c;
          goto LAB_001222a6;
        }
        pcVar7 = (char *)((ulong)(pcVar5->u32).lo + 0x10);
      }
      iVar2 = 0;
      piVar8 = (int *)lj_mem_realloc(L,(void *)0x0,0,0x800010);
      *(ulong *)(piVar8 + 2) = (ulong)(L->glref).ptr32;
      local_58.buf = (uint8_t *)(piVar8 + 4);
      local_58.len = 0x800000;
      local_58.ctx = piVar8;
      iVar3 = open64(pcVar7,0x241,0x1a4);
      if (iVar3 == -1) {
        iVar2 = 4;
        lVar10 = *(long *)(piVar8 + 2);
        *(int *)(lVar10 + 0x50) = *(int *)(lVar10 + 0x50) + -0x800010;
        *(long *)(lVar10 + 0x90) = *(long *)(lVar10 + 0x90) + 0x800010;
        (**(code **)(lVar10 + 0x40))(*(undefined8 *)(lVar10 + 0x48),piVar8,0x800010,0);
      }
      else {
        *piVar8 = iVar3;
        pcVar7 = (char *)0x0;
      }
      goto LAB_001222b3;
    }
    if (0 < (int)pcVar5->n) {
      local_58.interval = (uint64_t)(uint)(int)pcVar5->n;
      goto LAB_00122363;
    }
    pcVar7 = lj_err_allmsg + 0xf63;
  }
  else {
    if ((((pcVar5->field_2).it == 0xfffffffb) &&
        (uVar6 = (ulong)(pcVar5->u32).lo, *(char *)(uVar6 + 0x10) != '\0')) &&
       (*(char *)(uVar6 + 0x11) == '\0')) {
      pcVar7 = (char *)(uVar6 + 0x10);
      goto LAB_0012227a;
    }
LAB_001222a0:
    lVar10 = 0xf3d;
LAB_001222a6:
    pcVar7 = lj_err_allmsg + lVar10;
  }
  iVar2 = 1;
LAB_001222b3:
  if (iVar2 == 0) {
    iVar2 = luaM_sysprof_start(L,&local_58);
    if (iVar2 == 0) {
      iVar2 = 1;
      lua_pushboolean(L,1);
    }
    else {
      iVar2 = prof_error(L,iVar2,pcVar7);
    }
    return iVar2;
  }
  iVar2 = prof_error(L,iVar2,pcVar7);
  return iVar2;
}

Assistant:

LJLIB_CF(misc_sysprof_start)
{
#if !LJ_HASSYSPROF
  const char *err_details = err2msg(LJ_ERR_PROF_DETAILS_DISABLED);
  return prof_error(L, PROFILE_ERRUSE, err_details);
#else
  int status = PROFILE_SUCCESS;

  struct luam_Sysprof_Options opt = {};
  const char *err_details = NULL;

  status = parse_sysprof_opts(L, &opt, &err_details);
  if (LJ_UNLIKELY(status != PROFILE_SUCCESS))
    return prof_error(L, status, err_details);

  status = luaM_sysprof_start(L, &opt);
  if (LJ_UNLIKELY(status != PROFILE_SUCCESS))
    /* Allocated memory will be freed in on_stop callback. */
    return prof_error(L, status, err_details);

  lua_pushboolean(L, 1);
  return 1;
#endif /* !LJ_HASSYSPROF */
}